

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O0

void __thiscall GrpParser::featureSpecStruct(GrpParser *this)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  ASTArray *nodes;
  ASTArray *this_00;
  AST *this_01;
  AST *other;
  AST *this_02;
  long *in_RDI;
  ParserException *ex;
  RefAST tmp160_AST;
  RefAST tmp159_AST;
  RefAST tmp158_AST;
  RefAST X_AST;
  RefAST In_AST;
  RefToken In;
  RefAST I_AST;
  RefToken I;
  RefAST featureSpecStruct_AST;
  ASTPair currentAST;
  AST *in_stack_fffffffffffffdc8;
  AST *in_stack_fffffffffffffdd0;
  AST *in_stack_fffffffffffffdd8;
  AST *in_stack_fffffffffffffde0;
  RefCount<AST> *in_stack_fffffffffffffde8;
  ASTArray *in_stack_fffffffffffffdf0;
  RefToken *in_stack_fffffffffffffe00;
  ASTFactory *in_stack_fffffffffffffe08;
  Parser *in_stack_fffffffffffffe10;
  ASTFactory *in_stack_fffffffffffffe28;
  RefToken *in_stack_fffffffffffffe48;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  RefCount local_138 [63];
  undefined1 local_f9;
  undefined1 local_f8 [8];
  undefined1 local_f0 [24];
  undefined1 local_d8 [31];
  undefined1 local_b9;
  undefined1 local_b8 [8];
  undefined1 local_b0 [31];
  undefined1 local_91;
  undefined1 local_90 [16];
  GrpParser *in_stack_ffffffffffffff80;
  undefined1 local_78 [24];
  undefined1 local_60 [64];
  RefCount<AST> local_20 [4];
  
  RefCount<AST>::operator=((RefCount<AST> *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  ASTPair::ASTPair((ASTPair *)in_stack_fffffffffffffde0);
  RefCount<AST>::RefCount(&in_stack_fffffffffffffde0->down,&in_stack_fffffffffffffdd8->down);
  RefCount<Token>::RefCount
            ((RefCount<Token> *)in_stack_fffffffffffffde0,
             (RefCount<Token> *)in_stack_fffffffffffffdd8);
  RefCount<AST>::RefCount(&in_stack_fffffffffffffde0->down,&in_stack_fffffffffffffdd8->down);
  RefCount<Token>::RefCount
            ((RefCount<Token> *)in_stack_fffffffffffffde0,
             (RefCount<Token> *)in_stack_fffffffffffffdd8);
  RefCount<AST>::RefCount(&in_stack_fffffffffffffde0->down,&in_stack_fffffffffffffdd8->down);
  RefCount<AST>::RefCount(&in_stack_fffffffffffffde0->down,&in_stack_fffffffffffffdd8->down);
  iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
  if (iVar2 == 0xd) {
    (**(code **)(*in_RDI + 0x28))(local_60,in_RDI,1);
    RefCount<Token>::operator=
              ((RefCount<Token> *)in_stack_fffffffffffffdf0,
               (RefCount<Token> *)in_stack_fffffffffffffde8);
    RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffde0);
    RefCount<Token>::RefCount
              ((RefCount<Token> *)in_stack_fffffffffffffde0,
               (RefCount<Token> *)in_stack_fffffffffffffdd8);
    ASTFactory::create(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    RefCount<AST>::operator=((RefCount<AST> *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffdd0->down);
    RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffde0);
    Parser::match(in_stack_fffffffffffffe10,(int)((ulong)in_stack_fffffffffffffe08 >> 0x20));
  }
  else {
    if (iVar2 != 0x10) {
      local_91 = 1;
      uVar3 = __cxa_allocate_exception(0x40);
      (**(code **)(*in_RDI + 0x28))(local_90,in_RDI,1);
      NoViableAltException::NoViableAltException
                ((NoViableAltException *)
                 CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                 in_stack_fffffffffffffe48);
      local_91 = 0;
      __cxa_throw(uVar3,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException)
      ;
    }
    (**(code **)(*in_RDI + 0x28))(local_78,in_RDI,1);
    RefCount<Token>::operator=
              ((RefCount<Token> *)in_stack_fffffffffffffdf0,
               (RefCount<Token> *)in_stack_fffffffffffffde8);
    RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffde0);
    RefCount<Token>::RefCount
              ((RefCount<Token> *)in_stack_fffffffffffffde0,
               (RefCount<Token> *)in_stack_fffffffffffffdd8);
    ASTFactory::create(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    RefCount<AST>::operator=((RefCount<AST> *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffdd0->down);
    RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffde0);
    Parser::match(in_stack_fffffffffffffe10,(int)((ulong)in_stack_fffffffffffffe08 >> 0x20));
  }
  RefCount<AST>::RefCount(&in_stack_fffffffffffffde0->down,&in_stack_fffffffffffffdd8->down);
  (**(code **)(*in_RDI + 0x28))(local_b0,in_RDI,1);
  ASTFactory::create(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  RefCount<AST>::operator=((RefCount<AST> *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffdd0->down);
  RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffde0);
  Parser::match(in_stack_fffffffffffffe10,(int)((ulong)in_stack_fffffffffffffe08 >> 0x20));
  iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
  if (iVar2 != 0xc) {
    if ((iVar2 != 0xd) && (1 < iVar2 - 0x10U)) {
      local_b9 = 1;
      uVar3 = __cxa_allocate_exception(0x40);
      (**(code **)(*in_RDI + 0x28))(local_b8,in_RDI,1);
      NoViableAltException::NoViableAltException
                ((NoViableAltException *)
                 CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                 in_stack_fffffffffffffe48);
      local_b9 = 0;
      __cxa_throw(uVar3,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException)
      ;
    }
    featureSpecList(in_stack_ffffffffffffff80);
    RefCount<AST>::operator=((RefCount<AST> *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  }
  RefCount<AST>::RefCount(&in_stack_fffffffffffffde0->down,&in_stack_fffffffffffffdd8->down);
  (**(code **)(*in_RDI + 0x28))(local_d8,in_RDI,1);
  ASTFactory::create(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  RefCount<AST>::operator=((RefCount<AST> *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffdd0->down);
  RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffde0);
  Parser::match(in_stack_fffffffffffffe10,(int)((ulong)in_stack_fffffffffffffe08 >> 0x20));
  iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
  if (iVar2 == 8) {
    (**(code **)(*in_RDI + 0x20))(in_RDI,2);
    bVar1 = BitSet::member((BitSet *)in_stack_fffffffffffffdd8,
                           (int)((ulong)in_stack_fffffffffffffdd0 >> 0x20));
    if (!bVar1) goto LAB_00218f81;
    (**(code **)(*in_RDI + 0x20))(in_RDI,3);
    in_stack_fffffffffffffe57 =
         BitSet::member((BitSet *)in_stack_fffffffffffffdd8,
                        (int)((ulong)in_stack_fffffffffffffdd0 >> 0x20));
    if (!(bool)in_stack_fffffffffffffe57) goto LAB_00218f81;
    RefCount<AST>::RefCount(&in_stack_fffffffffffffde0->down,&in_stack_fffffffffffffdd8->down);
    (**(code **)(*in_RDI + 0x28))(local_f0,in_RDI,1);
    ASTFactory::create(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    iVar2 = (int)((ulong)in_stack_fffffffffffffe08 >> 0x20);
    RefCount<AST>::operator=((RefCount<AST> *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffdd0->down);
    RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffde0);
    Parser::match(in_stack_fffffffffffffe10,iVar2);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffdd0->down);
  }
  else {
LAB_00218f81:
    (**(code **)(*in_RDI + 0x20))(in_RDI,1);
    bVar1 = BitSet::member((BitSet *)in_stack_fffffffffffffdd8,
                           (int)((ulong)in_stack_fffffffffffffdd0 >> 0x20));
    if (!bVar1) {
LAB_0021903a:
      local_f9 = 1;
      uVar3 = __cxa_allocate_exception(0x40);
      (**(code **)(*in_RDI + 0x28))(local_f8,in_RDI,1);
      NoViableAltException::NoViableAltException
                ((NoViableAltException *)
                 CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                 in_stack_fffffffffffffe48);
      local_f9 = 0;
      __cxa_throw(uVar3,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException)
      ;
    }
    (**(code **)(*in_RDI + 0x20))(in_RDI,2);
    bVar1 = BitSet::member((BitSet *)in_stack_fffffffffffffdd8,
                           (int)((ulong)in_stack_fffffffffffffdd0 >> 0x20));
    if (!bVar1) goto LAB_0021903a;
    (**(code **)(*in_RDI + 0x20))(in_RDI,3);
    bVar1 = BitSet::member((BitSet *)in_stack_fffffffffffffdd8,
                           (int)((ulong)in_stack_fffffffffffffdd0 >> 0x20));
    if (!bVar1) goto LAB_0021903a;
  }
  RefCount<AST>::operator=((RefCount<AST> *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  nodes = (ASTArray *)operator_new(0x20);
  ASTArray::ASTArray(in_stack_fffffffffffffdf0,(int)((ulong)in_stack_fffffffffffffde8 >> 0x20));
  ASTFactory::create(in_stack_fffffffffffffe28,(int)((ulong)nodes >> 0x20));
  this_00 = ASTArray::add((ASTArray *)in_stack_fffffffffffffde0,&in_stack_fffffffffffffdd8->down);
  RefCount<AST>::RefCount(&in_stack_fffffffffffffde0->down,&in_stack_fffffffffffffdd8->down);
  ASTArray::add((ASTArray *)in_stack_fffffffffffffde0,&in_stack_fffffffffffffdd8->down);
  RefCount<AST>::RefCount(&in_stack_fffffffffffffde0->down,&in_stack_fffffffffffffdd8->down);
  ASTArray::add((ASTArray *)in_stack_fffffffffffffde0,&in_stack_fffffffffffffdd8->down);
  RefCount<AST>::RefCount(&in_stack_fffffffffffffde0->down,&in_stack_fffffffffffffdd8->down);
  ASTArray::add((ASTArray *)in_stack_fffffffffffffde0,&in_stack_fffffffffffffdd8->down);
  ASTFactory::make(in_stack_fffffffffffffe28,nodes);
  RefCount<AST>::operator=((RefCount<AST> *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffdd0->down);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffdd0->down);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffdd0->down);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffdd0->down);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffdd0->down);
  RefCount<AST>::operator=((RefCount<AST> *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  bVar1 = false;
  this_01 = RefCount::operator_cast_to_AST_((RefCount *)local_20);
  other = RefCount::operator_cast_to_AST_((RefCount *)&nullAST);
  if (this_01 != other) {
    in_stack_fffffffffffffde0 = RefCount<AST>::operator->(local_20);
    AST::getFirstChild(in_stack_fffffffffffffdc8);
    bVar1 = true;
    in_stack_fffffffffffffdd8 = RefCount::operator_cast_to_AST_(local_138);
    in_stack_fffffffffffffdd0 = RefCount::operator_cast_to_AST_((RefCount *)&nullAST);
    if (in_stack_fffffffffffffdd8 != in_stack_fffffffffffffdd0) {
      this_02 = RefCount<AST>::operator->(local_20);
      AST::getFirstChild(this_02);
      goto LAB_00219382;
    }
  }
  RefCount<AST>::RefCount(&in_stack_fffffffffffffde0->down,&in_stack_fffffffffffffdd8->down);
LAB_00219382:
  RefCount<AST>::operator=(&this_01->down,&other->down);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffdd0->down);
  if (bVar1) {
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffdd0->down);
  }
  ASTPair::advanceChildToEnd((ASTPair *)this_00);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffdd0->down);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffdd0->down);
  RefCount<AST>::operator=(&this_01->down,&other->down);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffdd0->down);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffdd0->down);
  RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffde0);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffdd0->down);
  RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffde0);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffdd0->down);
  ASTPair::~ASTPair((ASTPair *)in_stack_fffffffffffffdd0);
  return;
}

Assistant:

void GrpParser::featureSpecStruct() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST featureSpecStruct_AST = nullAST;
	RefToken  I = nullToken;
	RefAST I_AST = nullAST;
	RefToken  In = nullToken;
	RefAST In_AST = nullAST;
	RefAST X_AST = nullAST;
	
	try {      // for error handling
		{
		switch ( LA(1)) {
		case IDENT:
		{
			I = LT(1);
			I_AST = astFactory.create(I);
			match(IDENT);
			break;
		}
		case LITERAL_name:
		{
			In = LT(1);
			In_AST = astFactory.create(In);
			match(LITERAL_name);
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		RefAST tmp158_AST = nullAST;
		tmp158_AST = astFactory.create(LT(1));
		match(OP_LBRACE);
		{
		switch ( LA(1)) {
		case IDENT:
		case LITERAL_name:
		case LIT_INT:
		{
			featureSpecList();
			X_AST = returnAST;
			break;
		}
		case OP_RBRACE:
		{
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		RefAST tmp159_AST = nullAST;
		tmp159_AST = astFactory.create(LT(1));
		match(OP_RBRACE);
		{
		if ((LA(1)==OP_SEMI) && (_tokenSet_43.member(LA(2))) && (_tokenSet_4.member(LA(3)))) {
			RefAST tmp160_AST = nullAST;
			tmp160_AST = astFactory.create(LT(1));
			match(OP_SEMI);
		}
		else if ((_tokenSet_43.member(LA(1))) && (_tokenSet_4.member(LA(2))) && (_tokenSet_4.member(LA(3)))) {
		}
		else {
			throw NoViableAltException(LT(1));
		}
		
		}
		featureSpecStruct_AST = currentAST.root;
		featureSpecStruct_AST = astFactory.make( (new ASTArray(4))->add(astFactory.create(ZdotStruct))->add(I_AST)->add(In_AST)->add(X_AST));
		currentAST.root = featureSpecStruct_AST;
		currentAST.child = featureSpecStruct_AST!=nullAST &&featureSpecStruct_AST->getFirstChild()!=nullAST ?
			featureSpecStruct_AST->getFirstChild() : featureSpecStruct_AST;
		currentAST.advanceChildToEnd();
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_43);
	}
	returnAST = featureSpecStruct_AST;
}